

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFraig.c
# Opt level: O3

void Abc_NtkFromFraig2_rec(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,Vec_Ptr_t *vNodeReprs)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  void **ppvVar6;
  Abc_Obj_t *pAVar7;
  char *__function;
  int Fill;
  char *__file;
  char *__assertion;
  
  if (1 < (pNode->vFanins).nSize) {
    pAVar3 = pNode->pNtk;
    iVar1 = pNode->Id;
    Vec_IntFillExtra(&pAVar3->vTravIds,iVar1 + 1,(int)vNodeReprs);
    if (((long)iVar1 < 0) || ((pAVar3->vTravIds).nSize <= iVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    pAVar4 = pNode->pNtk;
    iVar2 = pAVar4->nTravIds;
    if ((pAVar3->vTravIds).pArray[iVar1] != iVar2) {
      iVar1 = pNode->Id;
      Vec_IntFillExtra(&pAVar4->vTravIds,iVar1 + 1,Fill);
      if (((long)iVar1 < 0) || ((pAVar4->vTravIds).nSize <= iVar1)) {
        __assertion = "i >= 0 && i < p->nSize";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h";
        __function = "void Vec_IntWriteEntry(Vec_Int_t *, int, int)";
      }
      else {
        (pAVar4->vTravIds).pArray[iVar1] = iVar2;
        if ((*(uint *)&pNode->field_0x14 & 0xf) == 7) {
          iVar1 = pNode->Id;
          if ((-1 < (long)iVar1) && (iVar1 < vNodeReprs->nSize)) {
            pAVar7 = (Abc_Obj_t *)vNodeReprs->pArray[iVar1];
            if (pAVar7 == (Abc_Obj_t *)0x0) {
              Abc_NtkFromFraig2_rec
                        (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanins).pArray],
                         vNodeReprs);
              Abc_NtkFromFraig2_rec
                        (pNtkNew,(Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[1]]
                         ,vNodeReprs);
              piVar5 = (pNode->vFanins).pArray;
              ppvVar6 = pNode->pNtk->vObjs->pArray;
              pAVar7 = Abc_AigAnd((Abc_Aig_t *)pNtkNew->pManFunc,
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)&pNode->field_0x14 >> 10 & 1) ^
                                  *(ulong *)((long)ppvVar6[*piVar5] + 0x40)),
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)&pNode->field_0x14 >> 0xb & 1) ^
                                  *(ulong *)((long)ppvVar6[piVar5[1]] + 0x40)));
            }
            else {
              Abc_NtkFromFraig2_rec(pNtkNew,pAVar7,vNodeReprs);
              pAVar7 = (Abc_Obj_t *)
                       ((ulong)((*(uint *)&pNode->field_0x14 ^ *(uint *)&pAVar7->field_0x14) >> 7 &
                               1) ^ (ulong)(pAVar7->field_6).pTemp);
            }
            (pNode->field_6).pTemp = pAVar7;
            return;
          }
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        __assertion = "Abc_ObjIsNode( pNode )";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFraig.c"
        ;
        __function = "void Abc_NtkFromFraig2_rec(Abc_Ntk_t *, Abc_Obj_t *, Vec_Ptr_t *)";
      }
      __assert_fail(__assertion,__file,0x1cb,__function);
    }
  }
  return;
}

Assistant:

void Abc_NtkFromFraig2_rec( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, Vec_Ptr_t * vNodeReprs )
{
    Abc_Obj_t * pRepr;
    // skip the PIs and constants
    if ( Abc_ObjFaninNum(pNode) < 2 )
        return;
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    assert( Abc_ObjIsNode( pNode ) );
    // get the node's representative
    if ( (pRepr = (Abc_Obj_t *)Vec_PtrEntry(vNodeReprs, pNode->Id)) )
    {
        Abc_NtkFromFraig2_rec( pNtkNew, pRepr, vNodeReprs );
        pNode->pCopy = Abc_ObjNotCond( pRepr->pCopy, pRepr->fPhase ^ pNode->fPhase );
        return;
    }
    Abc_NtkFromFraig2_rec( pNtkNew, Abc_ObjFanin0(pNode), vNodeReprs );
    Abc_NtkFromFraig2_rec( pNtkNew, Abc_ObjFanin1(pNode), vNodeReprs );
    pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
}